

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_substring.c
# Opt level: O0

int pcre2_substring_length_byname_16
              (pcre2_match_data_16 *match_data,PCRE2_SPTR16 stringname,size_t *sizeptr)

{
  ushort uVar1;
  int iVar2;
  uint32_t n;
  int entrysize;
  int failrc;
  PCRE2_SPTR16 entry;
  PCRE2_SPTR16 last;
  PCRE2_SPTR16 first;
  size_t *sizeptr_local;
  PCRE2_SPTR16 stringname_local;
  pcre2_match_data_16 *match_data_local;
  
  if (match_data->matchedby == 1) {
    match_data_local._4_4_ = 0xffffffd7;
  }
  else {
    first = (PCRE2_SPTR16)sizeptr;
    sizeptr_local = (size_t *)stringname;
    stringname_local = (PCRE2_SPTR16)match_data;
    match_data_local._4_4_ =
         pcre2_substring_nametable_scan_16(match_data->code,stringname,&last,&entry);
    if (-1 < (int)match_data_local._4_4_) {
      n = 0xffffffca;
      for (_entrysize = last; _entrysize <= entry;
          _entrysize = _entrysize + (int)match_data_local._4_4_) {
        uVar1 = *_entrysize;
        if ((uint)uVar1 < (uint)stringname_local[0x25]) {
          if (*(long *)(stringname_local + (ulong)uVar1 * 8 + 0x28) != -1) {
            iVar2 = pcre2_substring_length_bynumber_16
                              ((pcre2_match_data_16 *)stringname_local,(uint)uVar1,(size_t *)first);
            return iVar2;
          }
          n = 0xffffffc9;
        }
      }
      match_data_local._4_4_ = n;
    }
  }
  return match_data_local._4_4_;
}

Assistant:

PCRE2_CALL_CONVENTION
pcre2_substring_length_byname(pcre2_match_data *match_data,
  PCRE2_SPTR stringname, PCRE2_SIZE *sizeptr)
{
PCRE2_SPTR first, last, entry;
int failrc, entrysize;
if (match_data->matchedby == PCRE2_MATCHEDBY_DFA_INTERPRETER)
  return PCRE2_ERROR_DFA_UFUNC;
entrysize = pcre2_substring_nametable_scan(match_data->code, stringname,
  &first, &last);
if (entrysize < 0) return entrysize;
failrc = PCRE2_ERROR_UNAVAILABLE;
for (entry = first; entry <= last; entry += entrysize)
  {
  uint32_t n = GET2(entry, 0);
  if (n < match_data->oveccount)
    {
    if (match_data->ovector[n*2] != PCRE2_UNSET)
      return pcre2_substring_length_bynumber(match_data, n, sizeptr);
    failrc = PCRE2_ERROR_UNSET;
    }
  }
return failrc;
}